

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

void __thiscall luna::Lexer::LexSingleLineComment(Lexer *this)

{
  uint uVar1;
  int iVar2;
  
  while ((uVar1 = this->current_ + 1, 0xe < uVar1 || ((0x4801U >> (uVar1 & 0x1f) & 1) == 0))) {
    iVar2 = Next(this);
    this->current_ = iVar2;
  }
  return;
}

Assistant:

void Lexer::LexSingleLineComment()
    {
        while (current_ != '\r' && current_ != '\n' && current_ != EOF)
            current_ = Next();
    }